

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  OffsetData *offset_data;
  EXRHeader *exr_header;
  long lVar1;
  long *plVar2;
  pointer pOVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong __n;
  char *pcVar11;
  pointer pvVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong *puVar16;
  bool bVar17;
  int local_e4;
  allocator local_d1;
  char **local_d0;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_x_tiles;
  vector<int,_std::allocator<int>_> num_y_tiles;
  
  local_e4 = -3;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    pcVar11 = "Invalid argument for LoadEXRMultipartImageFromMemory()";
LAB_001aea71:
    std::__cxx11::string::string((string *)&e,pcVar11,(allocator *)&chunk_offset_table_list);
    tinyexr::SetErrorMessage(&e,err);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    __n = (ulong)num_parts;
    lVar10 = 0;
    for (uVar7 = 0; __n != uVar7; uVar7 = uVar7 + 1) {
      if ((ulong)exr_headers[uVar7]->header_len == 0) {
        pcVar11 = "EXRHeader variable is not initialized.";
        goto LAB_001aea71;
      }
      lVar10 = lVar10 + (ulong)exr_headers[uVar7]->header_len;
    }
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&chunk_offset_table_list,__n);
    puVar16 = (ulong *)(memory + lVar10 + 9);
    local_e4 = -3;
    local_d0 = err;
    for (uVar7 = 0; uVar7 != __n; uVar7 = uVar7 + 1) {
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                (&chunk_offset_table_list,
                 ((long)chunk_offset_table_list.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)chunk_offset_table_list.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      pOVar3 = chunk_offset_table_list.
               super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl
               .super__Vector_impl_data._M_finish;
      offset_data = chunk_offset_table_list.
                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -1;
      exr_header = exr_headers[uVar7];
      if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
        tinyexr::InitSingleResolutionOffsets(offset_data,(long)exr_header->chunk_count);
        plVar2 = *(long **)&(((offset_data->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl;
        uVar8 = 0;
LAB_001aea2c:
        lVar10 = *plVar2;
        if (uVar8 < (ulong)(plVar2[1] - lVar10 >> 3)) {
          if (*puVar16 < size) goto code_r0x001aea47;
          std::__cxx11::string::string
                    ((string *)&e,"Invalid offset size in EXR header chunks.",
                     (allocator *)&num_x_tiles);
LAB_001aead1:
          bVar17 = uVar7 < __n;
          tinyexr::SetErrorMessage(&e,err);
          std::__cxx11::string::~string((string *)&e);
          local_e4 = -4;
          goto LAB_001aeaf4;
        }
        goto LAB_001aea5d;
      }
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tinyexr::PrecalculateTileInfo(&num_x_tiles,&num_y_tiles,exr_header);
      iVar4 = tinyexr::InitTileOffsets(offset_data,exr_headers[uVar7],&num_x_tiles,&num_y_tiles);
      iVar6 = exr_headers[uVar7]->chunk_count;
      if (iVar4 != iVar6) {
        std::__cxx11::string::string((string *)&e,"Invalid offset table size.",&local_d1);
        tinyexr::SetErrorMessage(&e,local_d0);
        std::__cxx11::string::~string((string *)&e);
        local_e4 = -4;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_x_tiles.super__Vector_base<int,_std::allocator<int>_>);
      err = local_d0;
      if (iVar4 != iVar6) goto LAB_001aec5e;
      pvVar12 = pOVar3[-1].offsets.
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (uVar13 = 0; uVar8 = (ulong)uVar13,
          uVar8 < (ulong)(((long)pOVar3[-1].offsets.
                                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12) / 0x18)
          ; uVar13 = uVar13 + 1) {
        lVar10 = *(long *)&pvVar12[uVar8].
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl;
        for (uVar9 = 0;
            (ulong)uVar9 <
            (ulong)(((long)*(pointer *)
                            ((long)&pvVar12[uVar8].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl + 8) - lVar10) / 0x18); uVar9 = uVar9 + 1) {
          uVar5 = 0;
          while( true ) {
            lVar10 = *(long *)&pvVar12[uVar8].
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl;
            lVar14 = (ulong)uVar9 * 0x18;
            lVar1 = *(long *)(lVar10 + lVar14);
            if ((ulong)(*(long *)(lVar10 + 8 + lVar14) - lVar1 >> 3) <= (ulong)uVar5) break;
            if (size <= *puVar16) {
              std::__cxx11::string::string
                        ((string *)&e,"Invalid offset size in EXR header chunks.",
                         (allocator *)&num_x_tiles);
              goto LAB_001aead1;
            }
            *(ulong *)(lVar1 + (ulong)uVar5 * 8) = *puVar16 + 4;
            puVar16 = puVar16 + 1;
            uVar5 = uVar5 + 1;
            pvVar12 = (offset_data->offsets).
                      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
      }
LAB_001aea5d:
    }
    bVar17 = false;
LAB_001aeaf4:
    if (!bVar17) {
      uVar7 = 0;
      do {
        if (uVar7 == __n) {
          local_e4 = 0;
          break;
        }
        pvVar12 = chunk_offset_table_list.
                  super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7].offsets.
                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (uVar13 = 0; uVar8 = (ulong)uVar13,
            uVar8 < (ulong)(((long)chunk_offset_table_list.
                                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar7].offsets.
                                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12) /
                           0x18); uVar13 = uVar13 + 1) {
          for (uVar9 = 0;
              (ulong)uVar9 <
              (ulong)(((long)*(pointer *)
                              ((long)&pvVar12[uVar8].
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl + 8) -
                      *(long *)&pvVar12[uVar8].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl) / 0x18); uVar9 = uVar9 + 1) {
            lVar10 = *(long *)&pvVar12[uVar8].
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl;
            lVar14 = (ulong)uVar9 * 0x18;
            lVar1 = *(long *)(lVar10 + lVar14);
            uVar5 = 0;
            while (uVar15 = (ulong)uVar5,
                  uVar15 < (ulong)(*(long *)(lVar10 + 8 + lVar14) - lVar1 >> 3)) {
              uVar5 = uVar5 + 1;
              if (uVar7 != *(uint *)(memory + *(long *)(lVar1 + uVar15 * 8) + -4)) {
                std::__cxx11::string::string
                          ((string *)&e,"Invalid `part number\' in EXR header chunks.",
                           (allocator *)&num_x_tiles);
                tinyexr::SetErrorMessage(&e,local_d0);
                std::__cxx11::string::~string((string *)&e);
                local_e4 = -4;
                goto LAB_001aec5e;
              }
            }
            err = local_d0;
          }
        }
        e._M_dataplus._M_p = (pointer)&e.field_2;
        e._M_string_length = 0;
        e.field_2._M_local_buf[0] = '\0';
        iVar6 = tinyexr::DecodeChunk
                          (exr_images + uVar7,exr_headers[uVar7],
                           chunk_offset_table_list.
                           super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar7,memory,size,&e);
        if ((iVar6 != 0) && (local_e4 = iVar6, e._M_string_length != 0)) {
          tinyexr::SetErrorMessage(&e,err);
        }
        std::__cxx11::string::~string((string *)&e);
        uVar7 = uVar7 + 1;
      } while (iVar6 == 0);
    }
LAB_001aec5e:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
              (&chunk_offset_table_list);
  }
  return local_e4;
code_r0x001aea47:
  *(ulong *)(lVar10 + uVar8 * 8) = *puVar16 + 4;
  puVar16 = puVar16 + 1;
  uVar8 = uVar8 + 1;
  goto LAB_001aea2c;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8 
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identitical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}